

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
xLearn::FFMParser::Parse(FFMParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  byte bVar2;
  index_t iVar3;
  index_t iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  index_t row_id;
  DMatrix *this_00;
  Parser *this_01;
  uint64 pos;
  float feat_val;
  double dVar9;
  float local_ac;
  Logger local_a8;
  real_t local_a4;
  DMatrix *local_a0;
  char *local_98;
  string local_90;
  string local_70;
  FFMParser *local_50;
  uint64 local_48;
  uint64 local_40;
  uint64 local_38;
  
  local_98 = buf;
  if (buf == (char *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_a8.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Parse","");
    poVar8 = Logger::Start(ERR,&local_70,0x8b,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x8b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"buf",3);
    std::operator<<(poVar8," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        this_00 = matrix;
        DMatrix::Reset(matrix);
      }
      local_40 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_98,0,size);
      if (local_40 != 0) {
        pos = 0;
        local_a0 = matrix;
        local_50 = this;
        local_48 = size;
        do {
          DMatrix::AddRow(matrix);
          bVar2 = (this->super_Parser).has_label_;
          row_id = matrix->row_length - 1;
          if ((bool)bVar2 == true) {
            pcVar5 = strtok(line_buf,(this->super_Parser).splitor_._M_dataplus._M_p);
            dVar9 = atof(pcVar5);
            (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(int)row_id] = (float)dVar9;
            bVar2 = (local_50->super_Parser).has_label_;
          }
          else {
            (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(int)row_id] = -2.0;
          }
          local_ac = 0.0;
          local_38 = pos;
          if ((bVar2 & 1) == 0) {
            pcVar5 = strtok(line_buf,":");
            pcVar6 = strtok((char *)0x0,":");
            pcVar7 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\n')) {
              iVar3 = atoi(pcVar6);
              dVar9 = atof(pcVar7);
              feat_val = (float)dVar9;
              iVar4 = atoi(pcVar5);
              DMatrix::AddNode(local_a0,row_id,iVar3,feat_val,iVar4);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)feat_val),ZEXT416((uint)feat_val),ZEXT416(0));
              local_ac = auVar1._0_4_;
            }
          }
          pcVar5 = strtok((char *)0x0,":");
          pcVar6 = strtok((char *)0x0,":");
          this_01 = (Parser *)0x0;
          pcVar7 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          matrix = local_a0;
          while ((local_a0 = matrix, pcVar5 != (char *)0x0 && (*pcVar5 != '\n'))) {
            iVar3 = atoi(pcVar6);
            dVar9 = atof(pcVar7);
            local_a4 = (real_t)dVar9;
            iVar4 = atoi(pcVar5);
            DMatrix::AddNode(local_a0,row_id,iVar3,local_a4,iVar4);
            auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_ac),ZEXT416((uint)local_a4),
                                     ZEXT416((uint)local_a4));
            local_ac = auVar1._0_4_;
            pcVar5 = strtok((char *)0x0,":");
            pcVar6 = strtok((char *)0x0,":");
            this_01 = (Parser *)0x0;
            pcVar7 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            matrix = local_a0;
          }
          pos = local_38 + local_40;
          (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(int)row_id] = 1.0 / local_ac;
          local_40 = Parser::get_line_from_buffer(this_01,line_buf,local_98,pos,local_48);
        } while (local_40 != 0);
      }
      return;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_a8.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Parse","");
    poVar8 = Logger::Start(ERR,&local_70,0x8c,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x8c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"size",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
    std::operator<<(poVar8,"\n");
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_a8);
  abort();
}

Assistant:

void FFMParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix,
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *field_char = strtok(line_buf, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        index_t field_id = atoi(field_char);
        matrix.AddNode(i, idx, value, field_id);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *field_char = strtok(nullptr, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (field_char == nullptr || *field_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      index_t field_id = atoi(field_char);
      matrix.AddNode(i, idx, value, field_id);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}